

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_3537c6::PointerToMemberType::printLeft(PointerToMemberType *this,OutputStream *s)

{
  char *pcVar1;
  size_t sVar2;
  int iVar3;
  char cVar4;
  Node *pNVar5;
  
  (*this->MemberType->_vptr_Node[4])();
  pNVar5 = this->MemberType;
  cVar4 = '(';
  if (pNVar5->ArrayCache != Yes) {
    if (pNVar5->ArrayCache == Unknown) {
      iVar3 = (*pNVar5->_vptr_Node[1])(pNVar5,s);
      if ((char)iVar3 != '\0') goto LAB_00193962;
      pNVar5 = this->MemberType;
    }
    if (pNVar5->FunctionCache != Yes) {
      if (pNVar5->FunctionCache == Unknown) {
        iVar3 = (*pNVar5->_vptr_Node[2])(pNVar5,s);
        if ((char)iVar3 != '\0') goto LAB_00193962;
      }
      cVar4 = ' ';
    }
  }
LAB_00193962:
  OutputStream::grow(s,1);
  s->Buffer[s->CurrentPosition] = cVar4;
  s->CurrentPosition = s->CurrentPosition + 1;
  pNVar5 = this->ClassType;
  (*pNVar5->_vptr_Node[4])(pNVar5,s);
  if (pNVar5->RHSComponentCache != No) {
    (*pNVar5->_vptr_Node[5])(pNVar5,s);
  }
  OutputStream::grow(s,3);
  pcVar1 = s->Buffer;
  sVar2 = s->CurrentPosition;
  pcVar1[sVar2 + 2] = '*';
  pcVar1 = pcVar1 + sVar2;
  pcVar1[0] = ':';
  pcVar1[1] = ':';
  s->CurrentPosition = s->CurrentPosition + 3;
  return;
}

Assistant:

void printLeft(OutputStream &s) const override {
    MemberType->printLeft(s);
    if (MemberType->hasArray(s) || MemberType->hasFunction(s))
      s += "(";
    else
      s += " ";
    ClassType->print(s);
    s += "::*";
  }